

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O1

bool __thiscall QSqlCachedResult::fetchFirst(QSqlCachedResult *this)

{
  QSqlResultPrivate *pQVar1;
  bool bVar2;
  int iVar3;
  
  pQVar1 = (this->super_QSqlResult).d_ptr;
  if ((pQVar1->forwardOnly == true) &&
     (iVar3 = QSqlResult::at(&this->super_QSqlResult), iVar3 != -1)) {
    return false;
  }
  if ((pQVar1->forwardOnly == false) &&
     (*(int *)((long)&pQVar1[1].sqldriver.wp.value + 4) <= *(int *)&pQVar1[1].sqldriver.wp.value)) {
    (*(this->super_QSqlResult)._vptr_QSqlResult[3])(this,0);
    return true;
  }
  bVar2 = cacheNext(this);
  return bVar2;
}

Assistant:

bool QSqlCachedResult::fetchFirst()
{
    Q_D(QSqlCachedResult);
    if (d->forwardOnly && at() != QSql::BeforeFirstRow) {
        return false;
    }
    if (d->canSeek(0)) {
        setAt(0);
        return true;
    }
    return cacheNext();
}